

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeSimilarFunctions.cpp
# Opt level: O2

Function * __thiscall
wasm::EquivalentClass::replaceWithThunk
          (EquivalentClass *this,Builder *builder,Function *target,Function *shared,
          vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *params,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *extraArgs,bool isReturn)

{
  value_type *ppEVar1;
  pointer pTVar2;
  string_view target_00;
  size_t sVar3;
  Type *pTVar4;
  Call *pCVar5;
  Expression **value;
  value_type *__x;
  uint index;
  Signature SVar6;
  Type local_78;
  Type targetParams;
  undefined1 auStack_48 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> callOperands;
  
  auStack_48 = (undefined1  [8])0x0;
  callOperands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  callOperands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  SVar6 = HeapType::getSignature(&target->type);
  local_78 = SVar6.params.id;
  index = 0;
  while( true ) {
    sVar3 = wasm::Type::size(&local_78);
    if (sVar3 <= index) break;
    pTVar4 = wasm::Type::operator[](&local_78,(ulong)index);
    targetParams.id = (uintptr_t)Builder::makeLocalGet(builder,index,pTVar4->id);
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_48,
               (Expression **)&targetParams);
    index = index + 1;
  }
  ppEVar1 = (extraArgs->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)
            ._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (extraArgs->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
             )._M_impl.super__Vector_impl_data._M_start; __x != ppEVar1; __x = __x + 1) {
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_48,__x);
  }
  target_00 = (shared->super_Importable).super_Named.name.super_IString.str;
  SVar6 = HeapType::getSignature(&target->type);
  pCVar5 = Builder::makeCall(builder,(Name)target_00,
                             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             auStack_48,SVar6.results.id,isReturn);
  pTVar2 = (target->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((target->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_finish != pTVar2) {
    (target->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = pTVar2;
  }
  target->body = (Expression *)pCVar5;
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_48);
  return target;
}

Assistant:

Function*
EquivalentClass::replaceWithThunk(Builder& builder,
                                  Function* target,
                                  Function* shared,
                                  const std::vector<ParamInfo>& params,
                                  const std::vector<Expression*>& extraArgs,
                                  bool isReturn) {
  std::vector<Expression*> callOperands;
  Type targetParams = target->getParams();
  for (Index i = 0; i < targetParams.size(); i++) {
    callOperands.push_back(builder.makeLocalGet(i, targetParams[i]));
  }

  for (const auto& value : extraArgs) {
    callOperands.push_back(value);
  }

  auto ret = builder.makeCall(
    shared->name, callOperands, target->getResults(), isReturn);
  target->vars.clear();
  target->body = ret;
  return target;
}